

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap32::ClearHeapBlock(HeapBlockMap32 *this,void *address,uint pageCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  L2MapChunk *this_00;
  uint id2;
  ulong uVar5;
  
  uVar5 = (ulong)address >> 0x14 & 0xfff;
  uVar4 = (uint)address >> 0xc;
  id2 = uVar4 & 0xff;
  uVar4 = 0x100 - (uVar4 & 0xff);
  if (pageCount <= uVar4) {
    uVar4 = pageCount;
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    this_00 = this->map[uVar5];
    if (this_00 == (L2MapChunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x92,"(map[id1] != nullptr)","map[id1] != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      this_00 = this->map[uVar5];
    }
    L2MapChunk::Clear(this_00,id2,uVar4);
    pageCount = pageCount - uVar4;
    if (pageCount == 0) break;
    uVar5 = (ulong)((int)uVar5 + 1);
    uVar4 = 0x100;
    if (pageCount < 0x100) {
      uVar4 = pageCount;
    }
    id2 = 0;
  }
  return;
}

Assistant:

void
HeapBlockMap32::ClearHeapBlock(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);
    uint id2 = GetLevel2Id(address);

    uint currentPageCount = min(pageCount, L2Count - id2);

    while (true)
    {
        Assert(map[id1] != nullptr);

        map[id1]->Clear(id2, currentPageCount);

        pageCount -= currentPageCount;
        if (pageCount == 0)
        {
            return;
        }

        id2 = 0;
        id1++;
        currentPageCount = min(pageCount, L2Count);
    }
}